

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZStream.h
# Opt level: O0

void __thiscall TPZStream::Read<long_double>(TPZStream *this,TPZVec<long_double> *vec,void *context)

{
  longdouble *plVar1;
  TPZVec<long_double> *in_RSI;
  long *in_RDI;
  int64_t nc;
  int64_t c;
  ulong local_28 [3];
  TPZVec<long_double> *local_10;
  
  local_10 = in_RSI;
  (**(code **)(*in_RDI + 0xf8))(in_RDI,local_28,1);
  (*local_10->_vptr_TPZVec[3])(local_10,local_28[0]);
  if (local_28[0] != 0) {
    plVar1 = TPZVec<long_double>::operator[](local_10,0);
    (**(code **)(*in_RDI + 0x118))(in_RDI,plVar1,local_28[0] & 0xffffffff);
  }
  return;
}

Assistant:

void Read(TPZVec<T> &vec, void *context) {
        int64_t c, nc;
        this->Read(&nc, 1);
        vec.Resize(nc);
        if constexpr (std::is_same<std::string,T>::value ||
                      is_arithmetic_pz<T>::value){
            if (nc) this->Read(&vec[0], nc);
        }
        else{
          for (c = 0; c < nc; c++) {
            vec[c].Read(*this, context);
          }
        }
    }